

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

void cdef_filter_8_1_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  int iVar65;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint in_stack_00000008;
  v128 res_128;
  v256_conflict tap [8];
  int *sec_taps;
  int *pri_taps;
  int s2o2;
  int s2o1;
  int s1o2;
  int s1o1;
  int po2;
  int po1;
  v256_conflict min;
  v256_conflict max;
  v256_conflict cdef_large_value_mask;
  v256_conflict res;
  v256_conflict row;
  v256_conflict p3;
  v256_conflict p2;
  v256_conflict p1;
  v256_conflict p0;
  v256_conflict sum;
  int i;
  int clipping_required;
  uint16_t *dst16;
  uint8_t *dst8;
  v128 res_128_1;
  v256_conflict tap_2 [8];
  v256_conflict tap_1 [4];
  int i_1;
  int *sec_taps_1;
  int *pri_taps_1;
  int s2o2_1;
  int s2o1_1;
  int s1o2_1;
  int s1o1_1;
  int po2_1;
  int po1_1;
  v256_conflict cdef_large_value_mask_1;
  v256_conflict min_1;
  v256_conflict max_1;
  v256_conflict res_1;
  v256_conflict row_1;
  v256_conflict sum_1;
  v256_conflict p3_1;
  v256_conflict p2_1;
  v256_conflict p1_1;
  v256_conflict p0_1;
  int clipping_required_1;
  uint16_t *dst16_1;
  uint8_t *dst8_1;
  v256_conflict s_15;
  v256_conflict sign_15;
  v256_conflict diff_15;
  v256_conflict s_14;
  v256_conflict sign_14;
  v256_conflict diff_14;
  v256_conflict s_13;
  v256_conflict sign_13;
  v256_conflict diff_13;
  v256_conflict s_12;
  v256_conflict sign_12;
  v256_conflict diff_12;
  v256_conflict s_23;
  v256_conflict sign_23;
  v256_conflict diff_23;
  v256_conflict s_22;
  v256_conflict sign_22;
  v256_conflict diff_22;
  v256_conflict s_21;
  v256_conflict sign_21;
  v256_conflict diff_21;
  v256_conflict s_20;
  v256_conflict sign_20;
  v256_conflict diff_20;
  v256_conflict s_19;
  v256_conflict sign_19;
  v256_conflict diff_19;
  v256_conflict s_18;
  v256_conflict sign_18;
  v256_conflict diff_18;
  v256_conflict s_17;
  v256_conflict sign_17;
  v256_conflict diff_17;
  v256_conflict s_16;
  v256_conflict sign_16;
  v256_conflict diff_16;
  v256_conflict s_3;
  v256_conflict sign_3;
  v256_conflict diff_3;
  v256_conflict s_2;
  v256_conflict sign_2;
  v256_conflict diff_2;
  v256_conflict s_1;
  v256_conflict sign_1;
  v256_conflict diff_1;
  v256_conflict s;
  v256_conflict sign;
  v256_conflict diff;
  v256_conflict s_11;
  v256_conflict sign_11;
  v256_conflict diff_11;
  v256_conflict s_10;
  v256_conflict sign_10;
  v256_conflict diff_10;
  v256_conflict s_9;
  v256_conflict sign_9;
  v256_conflict diff_9;
  v256_conflict s_8;
  v256_conflict sign_8;
  v256_conflict diff_8;
  v256_conflict s_7;
  v256_conflict sign_7;
  v256_conflict diff_7;
  v256_conflict s_6;
  v256_conflict sign_6;
  v256_conflict diff_6;
  v256_conflict s_5;
  v256_conflict sign_5;
  v256_conflict diff_5;
  v256_conflict s_4;
  v256_conflict sign_4;
  v256_conflict diff_4;
  v256_conflict max_u8_2;
  v256_conflict max_u8;
  v256_conflict max_u8_3;
  v256_conflict max_u8_1;
  uint local_e2a0;
  uint local_e260;
  undefined8 uStack_e050;
  undefined8 uStack_e048;
  int local_df90;
  uint local_df60;
  int local_dccc;
  undefined8 uStack_dc10;
  undefined8 uStack_dc08;
  uint local_db20;
  undefined8 local_d970;
  undefined8 uStack_d968;
  undefined8 local_d940;
  undefined8 uStack_d938;
  undefined8 local_d910;
  undefined8 uStack_d908;
  undefined8 local_d8e0;
  undefined8 uStack_d8d8;
  ulong local_d6e0;
  ulong uStack_d6d8;
  ulong uStack_d6d0;
  ulong uStack_d6c8;
  ulong local_d600;
  ulong uStack_d5f8;
  ulong uStack_d5f0;
  ulong uStack_d5e8;
  ulong local_d520;
  ulong uStack_d518;
  ulong uStack_d510;
  ulong uStack_d508;
  ulong local_d440;
  ulong uStack_d438;
  ulong uStack_d430;
  ulong uStack_d428;
  ulong local_cc60;
  ulong uStack_cc58;
  ulong uStack_cc50;
  ulong uStack_cc48;
  ulong local_cb80;
  ulong uStack_cb78;
  ulong uStack_cb70;
  ulong uStack_cb68;
  ulong local_caa0;
  ulong uStack_ca98;
  ulong uStack_ca90;
  ulong uStack_ca88;
  ulong local_c9c0;
  ulong uStack_c9b8;
  ulong uStack_c9b0;
  ulong uStack_c9a8;
  ushort local_c964;
  undefined8 local_92c0;
  undefined8 local_9280;
  ulong uStack_9078;
  ulong uStack_9038;
  ulong local_72c0;
  ulong uStack_72b8;
  ulong uStack_72b0;
  ulong uStack_72a8;
  ulong local_7280;
  ulong uStack_7278;
  ulong uStack_7270;
  ulong uStack_7268;
  ulong local_7240;
  ulong uStack_7238;
  ulong uStack_7230;
  ulong uStack_7228;
  ulong local_7200;
  ulong uStack_71f8;
  ulong uStack_71f0;
  ulong uStack_71e8;
  ulong local_6fc0;
  ulong uStack_6fb8;
  ulong uStack_6fb0;
  ulong uStack_6fa8;
  ulong local_6f80;
  ulong uStack_6f78;
  ulong uStack_6f70;
  ulong uStack_6f68;
  ulong local_6f40;
  ulong uStack_6f38;
  ulong uStack_6f30;
  ulong uStack_6f28;
  ulong local_6f00;
  ulong uStack_6ef8;
  ulong uStack_6ef0;
  ulong uStack_6ee8;
  ulong uStack_1d48;
  ulong uStack_1d18;
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined4 local_1070;
  undefined4 local_1040;
  undefined4 local_1010;
  undefined4 local_fe0;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_c964 = (ushort)in_ECX;
  if (coeff_shift == 8) {
    local_df60 = in_stack_00000008;
    auVar67 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,2);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,3);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,4);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,5);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,6);
    vpinsrw_avx(auVar67,0xbfff,7);
    auVar67 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,2);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,3);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,4);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,5);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,6);
    vpinsrw_avx(auVar67,0xbfff,7);
    iVar2 = cdef_directions_padded[(long)in_R9D + 2][0];
    iVar3 = cdef_directions_padded[(long)in_R9D + 2][1];
    uVar64 = (int)in_ECX >> ((byte)sec_damping & 0x1f) & 1;
    if (in_ECX != 0) {
      iVar65 = get_msb(in_ECX);
      if ((int)(in_stack_00000008 - iVar65) < 0) {
        local_e260 = 0;
      }
      else {
        iVar65 = get_msb(in_ECX);
        local_e260 = in_stack_00000008 - iVar65;
      }
      local_df60 = local_e260;
    }
    for (local_df90 = 0; local_df90 < block_width; local_df90 = local_df90 + 2) {
      auVar67 = *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90) * 2);
      auVar66 = ZEXT116(0) * auVar67 +
                ZEXT116(1) * *(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + 0x90) * 2);
      auVar67 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
      uStack_e050 = auVar67._0_8_;
      uStack_e048 = auVar67._8_8_;
      auVar67 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar2) * 2));
      auVar4 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar2) * 2));
      local_d8e0 = auVar67._0_8_;
      uStack_d8d8 = auVar67._8_8_;
      auVar67 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar2) * 2));
      auVar68 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)((local_df90 * 0x90 - iVar2) + 0x90) * 2));
      local_d910 = auVar67._0_8_;
      uStack_d908 = auVar67._8_8_;
      auVar10._16_8_ = local_d8e0;
      auVar10._0_16_ = auVar4;
      auVar10._24_8_ = uStack_d8d8;
      auVar9._16_8_ = uStack_e050;
      auVar9._0_16_ = auVar66;
      auVar9._24_8_ = uStack_e048;
      auVar8 = vpsubw_avx2(auVar10,auVar9);
      auVar5 = vpsraw_avx2(auVar8,ZEXT416(0xf));
      auVar8 = vpabsw_avx2(auVar8);
      auVar67 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,2);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,3);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,4);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,5);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,6);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
      uStack_730 = auVar4._0_8_;
      uStack_728 = auVar4._8_8_;
      auVar6 = vpsrlw_avx2(auVar8,ZEXT416(local_df60));
      auVar28._16_8_ = uStack_730;
      auVar28._0_16_ = auVar67;
      auVar28._24_8_ = uStack_728;
      auVar6 = vpsubusw_avx2(auVar28,auVar6);
      local_c9c0 = auVar5._0_8_;
      uStack_c9b8 = auVar5._8_8_;
      uStack_c9b0 = auVar5._16_8_;
      uStack_c9a8 = auVar5._24_8_;
      auVar8 = vpminsw_avx2(auVar8,auVar6);
      auVar8 = vpaddw_avx2(auVar5,auVar8);
      local_72c0 = auVar8._0_8_;
      uStack_72b8 = auVar8._8_8_;
      uStack_72b0 = auVar8._16_8_;
      uStack_72a8 = auVar8._24_8_;
      auVar12._16_8_ = local_d910;
      auVar12._0_16_ = auVar68;
      auVar12._24_8_ = uStack_d908;
      auVar11._16_8_ = uStack_e050;
      auVar11._0_16_ = auVar66;
      auVar11._24_8_ = uStack_e048;
      auVar8 = vpsubw_avx2(auVar12,auVar11);
      auVar5 = vpsraw_avx2(auVar8,ZEXT416(0xf));
      auVar8 = vpabsw_avx2(auVar8);
      auVar67 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,2);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,3);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,4);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,5);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,6);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
      uStack_6f0 = auVar4._0_8_;
      uStack_6e8 = auVar4._8_8_;
      auVar6 = vpsrlw_avx2(auVar8,ZEXT416(local_df60));
      auVar27._16_8_ = uStack_6f0;
      auVar27._0_16_ = auVar67;
      auVar27._24_8_ = uStack_6e8;
      auVar6 = vpsubusw_avx2(auVar27,auVar6);
      local_caa0 = auVar5._0_8_;
      uStack_ca98 = auVar5._8_8_;
      uStack_ca90 = auVar5._16_8_;
      uStack_ca88 = auVar5._24_8_;
      auVar8 = vpminsw_avx2(auVar8,auVar6);
      auVar8 = vpaddw_avx2(auVar5,auVar8);
      local_7280 = auVar8._0_8_;
      uStack_7278 = auVar8._8_8_;
      uStack_7270 = auVar8._16_8_;
      uStack_7268 = auVar8._24_8_;
      uVar1 = (ushort)cdef_pri_taps[(int)uVar64][0];
      auVar67 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,2);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,3);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,4);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,5);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,6);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,7);
      auVar4 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,2);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,3);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,4);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,5);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,6);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,7);
      uStack_230 = auVar4._0_8_;
      uStack_228 = auVar4._8_8_;
      auVar32._8_8_ = uStack_72b8 ^ uStack_c9b8;
      auVar32._0_8_ = local_72c0 ^ local_c9c0;
      auVar32._16_8_ = uStack_72b0 ^ uStack_c9b0;
      auVar32._24_8_ = uStack_72a8 ^ uStack_c9a8;
      auVar31._8_8_ = uStack_7278 ^ uStack_ca98;
      auVar31._0_8_ = local_7280 ^ local_caa0;
      auVar31._16_8_ = uStack_7270 ^ uStack_ca90;
      auVar31._24_8_ = uStack_7268 ^ uStack_ca88;
      auVar8 = vpaddw_avx2(auVar32,auVar31);
      auVar41._16_8_ = uStack_230;
      auVar41._0_16_ = auVar67;
      auVar41._24_8_ = uStack_228;
      auVar8 = vpmullw_avx2(auVar41,auVar8);
      auVar5 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar8);
      auVar67 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 + iVar3) * 2));
      auVar4 = vlddqu_avx(*(undefined1 (*) [16])
                           (in_RDX + (long)(local_df90 * 0x90 + 0x90 + iVar3) * 2));
      local_d940 = auVar67._0_8_;
      uStack_d938 = auVar67._8_8_;
      auVar67 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX + (long)(local_df90 * 0x90 - iVar3) * 2));
      auVar68 = vlddqu_avx(*(undefined1 (*) [16])
                            (in_RDX + (long)((local_df90 * 0x90 - iVar3) + 0x90) * 2));
      local_d970 = auVar67._0_8_;
      uStack_d968 = auVar67._8_8_;
      auVar14._16_8_ = local_d940;
      auVar14._0_16_ = auVar4;
      auVar14._24_8_ = uStack_d938;
      auVar13._16_8_ = uStack_e050;
      auVar13._0_16_ = auVar66;
      auVar13._24_8_ = uStack_e048;
      auVar8 = vpsubw_avx2(auVar14,auVar13);
      auVar6 = vpsraw_avx2(auVar8,ZEXT416(0xf));
      auVar8 = vpabsw_avx2(auVar8);
      auVar67 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,2);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,3);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,4);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,5);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,6);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
      uStack_6b0 = auVar4._0_8_;
      uStack_6a8 = auVar4._8_8_;
      auVar7 = vpsrlw_avx2(auVar8,ZEXT416(local_df60));
      auVar26._16_8_ = uStack_6b0;
      auVar26._0_16_ = auVar67;
      auVar26._24_8_ = uStack_6a8;
      auVar7 = vpsubusw_avx2(auVar26,auVar7);
      local_cb80 = auVar6._0_8_;
      uStack_cb78 = auVar6._8_8_;
      uStack_cb70 = auVar6._16_8_;
      uStack_cb68 = auVar6._24_8_;
      auVar8 = vpminsw_avx2(auVar8,auVar7);
      auVar8 = vpaddw_avx2(auVar6,auVar8);
      local_7240 = auVar8._0_8_;
      uStack_7238 = auVar8._8_8_;
      uStack_7230 = auVar8._16_8_;
      uStack_7228 = auVar8._24_8_;
      auVar16._16_8_ = local_d970;
      auVar16._0_16_ = auVar68;
      auVar16._24_8_ = uStack_d968;
      auVar15._16_8_ = uStack_e050;
      auVar15._0_16_ = auVar66;
      auVar15._24_8_ = uStack_e048;
      auVar8 = vpsubw_avx2(auVar16,auVar15);
      auVar6 = vpsraw_avx2(auVar8,ZEXT416(0xf));
      auVar8 = vpabsw_avx2(auVar8);
      auVar67 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,2);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,3);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,4);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,5);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,6);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
      uStack_670 = auVar4._0_8_;
      uStack_668 = auVar4._8_8_;
      auVar7 = vpsrlw_avx2(auVar8,ZEXT416(local_df60));
      auVar25._16_8_ = uStack_670;
      auVar25._0_16_ = auVar67;
      auVar25._24_8_ = uStack_668;
      auVar7 = vpsubusw_avx2(auVar25,auVar7);
      local_cc60 = auVar6._0_8_;
      uStack_cc58 = auVar6._8_8_;
      uStack_cc50 = auVar6._16_8_;
      uStack_cc48 = auVar6._24_8_;
      auVar8 = vpminsw_avx2(auVar8,auVar7);
      auVar8 = vpaddw_avx2(auVar6,auVar8);
      local_7200 = auVar8._0_8_;
      uStack_71f8 = auVar8._8_8_;
      uStack_71f0 = auVar8._16_8_;
      uStack_71e8 = auVar8._24_8_;
      uVar1 = (ushort)cdef_pri_taps[(int)uVar64][1];
      auVar67 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,2);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,3);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,4);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,5);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,6);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,7);
      auVar4 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,2);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,3);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,4);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,5);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,6);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,7);
      auVar68 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
      uStack_1f0 = auVar68._0_8_;
      uStack_1e8 = auVar68._8_8_;
      auVar34._8_8_ = uStack_7238 ^ uStack_cb78;
      auVar34._0_8_ = local_7240 ^ local_cb80;
      auVar34._16_8_ = uStack_7230 ^ uStack_cb70;
      auVar34._24_8_ = uStack_7228 ^ uStack_cb68;
      auVar33._8_8_ = uStack_71f8 ^ uStack_cc58;
      auVar33._0_8_ = local_7200 ^ local_cc60;
      auVar33._16_8_ = uStack_71f0 ^ uStack_cc50;
      auVar33._24_8_ = uStack_71e8 ^ uStack_cc48;
      auVar8 = vpaddw_avx2(auVar34,auVar33);
      auVar42._16_8_ = uStack_1f0;
      auVar42._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar4;
      auVar42._24_8_ = uStack_1e8;
      auVar8 = vpmullw_avx2(auVar42,auVar8);
      auVar8 = vpaddw_avx2(auVar5,auVar8);
      uStack_9078 = SUB328(ZEXT832(0),4);
      auVar5 = vpcmpgtw_avx2(ZEXT832(uStack_9078) << 0x40,auVar8);
      auVar8 = vpaddw_avx2(auVar8,auVar5);
      auVar67 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar67 = vpinsrw_avx(auVar67,8,2);
      auVar67 = vpinsrw_avx(auVar67,8,3);
      auVar67 = vpinsrw_avx(auVar67,8,4);
      auVar67 = vpinsrw_avx(auVar67,8,5);
      auVar67 = vpinsrw_avx(auVar67,8,6);
      auVar67 = vpinsrw_avx(auVar67,8,7);
      auVar4 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar4 = vpinsrw_avx(auVar4,8,2);
      auVar4 = vpinsrw_avx(auVar4,8,3);
      auVar4 = vpinsrw_avx(auVar4,8,4);
      auVar4 = vpinsrw_avx(auVar4,8,5);
      auVar4 = vpinsrw_avx(auVar4,8,6);
      auVar4 = vpinsrw_avx(auVar4,8,7);
      auVar68 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
      uStack_2f0 = auVar68._0_8_;
      uStack_2e8 = auVar68._8_8_;
      auVar29._16_8_ = uStack_2f0;
      auVar29._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar4;
      auVar29._24_8_ = uStack_2e8;
      auVar8 = vpaddw_avx2(auVar8,auVar29);
      auVar8 = vpsraw_avx2(auVar8,ZEXT416(4));
      auVar30._16_8_ = uStack_e050;
      auVar30._0_16_ = auVar66;
      auVar30._24_8_ = uStack_e048;
      auVar8 = vpaddw_avx2(auVar30,auVar8);
      auVar8 = vpackuswb_avx2(auVar8,auVar8);
      auVar8 = vpermq_avx2(auVar8,0xd8);
      auVar67 = vpsrldq_avx(auVar8._0_16_,8);
      local_9280 = auVar67._0_8_;
      *(undefined8 *)(in_RDI + local_df90 * in_ESI) = local_9280;
      uStack_1d48 = SUB168(ZEXT816(0),4);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uStack_1d48;
      auVar67 = vpunpcklqdq_avx(auVar8._0_16_,auVar61 << 0x40);
      local_92c0 = auVar67._0_8_;
      *(undefined8 *)(in_RDI + (local_df90 + 1) * in_ESI) = local_92c0;
    }
  }
  else {
    local_db20 = in_stack_00000008;
    auVar67 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,2);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,3);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,4);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,5);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,6);
    vpinsrw_avx(auVar67,0xbfff,7);
    auVar67 = vpinsrw_avx(ZEXT216(0xbfff),0xbfff,1);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,2);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,3);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,4);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,5);
    auVar67 = vpinsrw_avx(auVar67,0xbfff,6);
    vpinsrw_avx(auVar67,0xbfff,7);
    iVar2 = cdef_directions_padded[(long)in_R9D + 2][0];
    iVar3 = cdef_directions_padded[(long)in_R9D + 2][1];
    uVar64 = (int)in_ECX >> ((byte)sec_damping & 0x1f) & 1;
    if (in_ECX != 0) {
      iVar65 = get_msb(in_ECX);
      if ((int)(in_stack_00000008 - iVar65) < 0) {
        local_e2a0 = 0;
      }
      else {
        iVar65 = get_msb(in_ECX);
        local_e2a0 = in_stack_00000008 - iVar65;
      }
      local_db20 = local_e2a0;
    }
    for (local_dccc = 0; local_dccc < block_width; local_dccc = local_dccc + 4) {
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90) * 2);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90) * 2);
      auVar67 = vpunpcklqdq_avx(auVar66,auVar67);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0) * 2);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120) * 2);
      auVar4 = vpunpcklqdq_avx(auVar68,auVar4);
      auVar68 = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar4;
      auVar67 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
      uStack_dc10 = auVar67._0_8_;
      uStack_dc08 = auVar67._8_8_;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar2) * 2);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar2) * 2);
      auVar67 = vpunpcklqdq_avx(auVar48,auVar47);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar2) * 2);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar2) * 2);
      auVar4 = vpunpcklqdq_avx(auVar46,auVar45);
      local_1b60 = auVar67._0_8_;
      uStack_1b58 = auVar67._8_8_;
      auVar5._16_8_ = local_1b60;
      auVar5._0_16_ = auVar4;
      auVar5._24_8_ = uStack_1b58;
      auVar8._16_8_ = uStack_dc10;
      auVar8._0_16_ = auVar68;
      auVar8._24_8_ = uStack_dc08;
      auVar8 = vpsubw_avx2(auVar5,auVar8);
      auVar5 = vpsraw_avx2(auVar8,ZEXT416(0xf));
      auVar8 = vpabsw_avx2(auVar8);
      auVar67 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,2);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,3);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,4);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,5);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,6);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
      uStack_430 = auVar4._0_8_;
      uStack_428 = auVar4._8_8_;
      auVar6 = vpsrlw_avx2(auVar8,ZEXT416(local_db20));
      auVar24._16_8_ = uStack_430;
      auVar24._0_16_ = auVar67;
      auVar24._24_8_ = uStack_428;
      auVar6 = vpsubusw_avx2(auVar24,auVar6);
      local_d440 = auVar5._0_8_;
      uStack_d438 = auVar5._8_8_;
      uStack_d430 = auVar5._16_8_;
      uStack_d428 = auVar5._24_8_;
      auVar8 = vpminsw_avx2(auVar8,auVar6);
      auVar8 = vpaddw_avx2(auVar5,auVar8);
      local_6fc0 = auVar8._0_8_;
      uStack_6fb8 = auVar8._8_8_;
      uStack_6fb0 = auVar8._16_8_;
      uStack_6fa8 = auVar8._24_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x90) * 2);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar2) * 2);
      auVar67 = vpunpcklqdq_avx(auVar52,auVar51);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x1b0) * 2);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar2) + 0x120) * 2);
      auVar4 = vpunpcklqdq_avx(auVar50,auVar49);
      local_1bd0 = auVar67._0_8_;
      uStack_1bc8 = auVar67._8_8_;
      auVar7._16_8_ = local_1bd0;
      auVar7._0_16_ = auVar4;
      auVar7._24_8_ = uStack_1bc8;
      auVar6._16_8_ = uStack_dc10;
      auVar6._0_16_ = auVar68;
      auVar6._24_8_ = uStack_dc08;
      auVar8 = vpsubw_avx2(auVar7,auVar6);
      auVar5 = vpsraw_avx2(auVar8,ZEXT416(0xf));
      auVar8 = vpabsw_avx2(auVar8);
      auVar67 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,2);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,3);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,4);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,5);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,6);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
      uStack_3f0 = auVar4._0_8_;
      uStack_3e8 = auVar4._8_8_;
      auVar6 = vpsrlw_avx2(auVar8,ZEXT416(local_db20));
      auVar23._16_8_ = uStack_3f0;
      auVar23._0_16_ = auVar67;
      auVar23._24_8_ = uStack_3e8;
      auVar6 = vpsubusw_avx2(auVar23,auVar6);
      local_d520 = auVar5._0_8_;
      uStack_d518 = auVar5._8_8_;
      uStack_d510 = auVar5._16_8_;
      uStack_d508 = auVar5._24_8_;
      auVar8 = vpminsw_avx2(auVar8,auVar6);
      auVar8 = vpaddw_avx2(auVar5,auVar8);
      local_6f80 = auVar8._0_8_;
      uStack_6f78 = auVar8._8_8_;
      uStack_6f70 = auVar8._16_8_;
      uStack_6f68 = auVar8._24_8_;
      uVar1 = (ushort)cdef_pri_taps[(int)uVar64][0];
      auVar67 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,2);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,3);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,4);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,5);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,6);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,7);
      auVar4 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,2);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,3);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,4);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,5);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,6);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,7);
      uStack_b0 = auVar4._0_8_;
      uStack_a8 = auVar4._8_8_;
      auVar38._8_8_ = uStack_6fb8 ^ uStack_d438;
      auVar38._0_8_ = local_6fc0 ^ local_d440;
      auVar38._16_8_ = uStack_6fb0 ^ uStack_d430;
      auVar38._24_8_ = uStack_6fa8 ^ uStack_d428;
      auVar37._8_8_ = uStack_6f78 ^ uStack_d518;
      auVar37._0_8_ = local_6f80 ^ local_d520;
      auVar37._16_8_ = uStack_6f70 ^ uStack_d510;
      auVar37._24_8_ = uStack_6f68 ^ uStack_d508;
      auVar8 = vpaddw_avx2(auVar38,auVar37);
      auVar43._16_8_ = uStack_b0;
      auVar43._0_16_ = auVar67;
      auVar43._24_8_ = uStack_a8;
      auVar8 = vpmullw_avx2(auVar43,auVar8);
      auVar5 = vpaddw_avx2(ZEXT1632(ZEXT816(0)),auVar8);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x90 + iVar3) * 2);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + iVar3) * 2);
      auVar67 = vpunpcklqdq_avx(auVar56,auVar55);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x1b0 + iVar3) * 2);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 + 0x120 + iVar3) * 2);
      auVar4 = vpunpcklqdq_avx(auVar54,auVar53);
      local_1c40 = auVar67._0_8_;
      uStack_1c38 = auVar67._8_8_;
      auVar18._16_8_ = local_1c40;
      auVar18._0_16_ = auVar4;
      auVar18._24_8_ = uStack_1c38;
      auVar17._16_8_ = uStack_dc10;
      auVar17._0_16_ = auVar68;
      auVar17._24_8_ = uStack_dc08;
      auVar8 = vpsubw_avx2(auVar18,auVar17);
      auVar6 = vpsraw_avx2(auVar8,ZEXT416(0xf));
      auVar8 = vpabsw_avx2(auVar8);
      auVar67 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,2);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,3);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,4);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,5);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,6);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
      uStack_3b0 = auVar4._0_8_;
      uStack_3a8 = auVar4._8_8_;
      auVar7 = vpsrlw_avx2(auVar8,ZEXT416(local_db20));
      auVar22._16_8_ = uStack_3b0;
      auVar22._0_16_ = auVar67;
      auVar22._24_8_ = uStack_3a8;
      auVar7 = vpsubusw_avx2(auVar22,auVar7);
      local_d600 = auVar6._0_8_;
      uStack_d5f8 = auVar6._8_8_;
      uStack_d5f0 = auVar6._16_8_;
      uStack_d5e8 = auVar6._24_8_;
      auVar8 = vpminsw_avx2(auVar8,auVar7);
      auVar8 = vpaddw_avx2(auVar6,auVar8);
      local_6f40 = auVar8._0_8_;
      uStack_6f38 = auVar8._8_8_;
      uStack_6f30 = auVar8._16_8_;
      uStack_6f28 = auVar8._24_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x90) * 2);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(ulong *)(in_RDX + (long)(local_dccc * 0x90 - iVar3) * 2);
      auVar67 = vpunpcklqdq_avx(auVar60,auVar59);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x1b0) * 2);
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *(ulong *)(in_RDX + (long)((local_dccc * 0x90 - iVar3) + 0x120) * 2);
      auVar4 = vpunpcklqdq_avx(auVar58,auVar57);
      local_1cb0 = auVar67._0_8_;
      uStack_1ca8 = auVar67._8_8_;
      auVar20._16_8_ = local_1cb0;
      auVar20._0_16_ = auVar4;
      auVar20._24_8_ = uStack_1ca8;
      auVar19._16_8_ = uStack_dc10;
      auVar19._0_16_ = auVar68;
      auVar19._24_8_ = uStack_dc08;
      auVar8 = vpsubw_avx2(auVar20,auVar19);
      auVar6 = vpsraw_avx2(auVar8,ZEXT416(0xf));
      auVar8 = vpabsw_avx2(auVar8);
      auVar67 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,2);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,3);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,4);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,5);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,6);
      auVar67 = vpinsrw_avx(auVar67,in_ECX & 0xffff,7);
      auVar4 = vpinsrw_avx(ZEXT216(local_c964),in_ECX & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,in_ECX & 0xffff,7);
      uStack_370 = auVar4._0_8_;
      uStack_368 = auVar4._8_8_;
      auVar7 = vpsrlw_avx2(auVar8,ZEXT416(local_db20));
      auVar21._16_8_ = uStack_370;
      auVar21._0_16_ = auVar67;
      auVar21._24_8_ = uStack_368;
      auVar7 = vpsubusw_avx2(auVar21,auVar7);
      local_d6e0 = auVar6._0_8_;
      uStack_d6d8 = auVar6._8_8_;
      uStack_d6d0 = auVar6._16_8_;
      uStack_d6c8 = auVar6._24_8_;
      auVar8 = vpminsw_avx2(auVar8,auVar7);
      auVar8 = vpaddw_avx2(auVar6,auVar8);
      local_6f00 = auVar8._0_8_;
      uStack_6ef8 = auVar8._8_8_;
      uStack_6ef0 = auVar8._16_8_;
      uStack_6ee8 = auVar8._24_8_;
      uVar1 = (ushort)cdef_pri_taps[(int)uVar64][1];
      auVar67 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,2);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,3);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,4);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,5);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,6);
      auVar67 = vpinsrw_avx(auVar67,(uint)uVar1,7);
      auVar4 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,2);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,3);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,4);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,5);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,6);
      auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,7);
      auVar66 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
      uStack_70 = auVar66._0_8_;
      uStack_68 = auVar66._8_8_;
      auVar40._8_8_ = uStack_6f38 ^ uStack_d5f8;
      auVar40._0_8_ = local_6f40 ^ local_d600;
      auVar40._16_8_ = uStack_6f30 ^ uStack_d5f0;
      auVar40._24_8_ = uStack_6f28 ^ uStack_d5e8;
      auVar39._8_8_ = uStack_6ef8 ^ uStack_d6d8;
      auVar39._0_8_ = local_6f00 ^ local_d6e0;
      auVar39._16_8_ = uStack_6ef0 ^ uStack_d6d0;
      auVar39._24_8_ = uStack_6ee8 ^ uStack_d6c8;
      auVar8 = vpaddw_avx2(auVar40,auVar39);
      auVar44._16_8_ = uStack_70;
      auVar44._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar4;
      auVar44._24_8_ = uStack_68;
      auVar8 = vpmullw_avx2(auVar44,auVar8);
      auVar8 = vpaddw_avx2(auVar5,auVar8);
      uStack_9038 = SUB328(ZEXT832(0),4);
      auVar5 = vpcmpgtw_avx2(ZEXT832(uStack_9038) << 0x40,auVar8);
      auVar8 = vpaddw_avx2(auVar8,auVar5);
      auVar67 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar67 = vpinsrw_avx(auVar67,8,2);
      auVar67 = vpinsrw_avx(auVar67,8,3);
      auVar67 = vpinsrw_avx(auVar67,8,4);
      auVar67 = vpinsrw_avx(auVar67,8,5);
      auVar67 = vpinsrw_avx(auVar67,8,6);
      auVar67 = vpinsrw_avx(auVar67,8,7);
      auVar4 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar4 = vpinsrw_avx(auVar4,8,2);
      auVar4 = vpinsrw_avx(auVar4,8,3);
      auVar4 = vpinsrw_avx(auVar4,8,4);
      auVar4 = vpinsrw_avx(auVar4,8,5);
      auVar4 = vpinsrw_avx(auVar4,8,6);
      auVar4 = vpinsrw_avx(auVar4,8,7);
      auVar66 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
      uStack_170 = auVar66._0_8_;
      uStack_168 = auVar66._8_8_;
      auVar35._16_8_ = uStack_170;
      auVar35._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar4;
      auVar35._24_8_ = uStack_168;
      auVar8 = vpaddw_avx2(auVar8,auVar35);
      auVar8 = vpsraw_avx2(auVar8,ZEXT416(4));
      auVar36._16_8_ = uStack_dc10;
      auVar36._0_16_ = auVar68;
      auVar36._24_8_ = uStack_dc08;
      auVar8 = vpaddw_avx2(auVar36,auVar8);
      auVar8 = vpackuswb_avx2(auVar8,auVar8);
      auVar8 = vpermq_avx2(auVar8,0xd8);
      auVar4 = auVar8._0_16_;
      auVar67 = vpsrldq_avx(auVar4,8);
      auVar67 = vpsrldq_avx(auVar67,4);
      local_1040 = auVar67._0_4_;
      *(undefined4 *)(in_RDI + local_dccc * in_ESI) = local_1040;
      auVar67 = vpsrldq_avx(auVar4,8);
      local_fe0 = auVar67._0_4_;
      *(undefined4 *)(in_RDI + (local_dccc + 1) * in_ESI) = local_fe0;
      uStack_1d18 = SUB168(ZEXT816(0),4);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uStack_1d18;
      auVar67 = vpunpcklqdq_avx(auVar4,auVar62 << 0x40);
      auVar67 = vpsrldq_avx(auVar67,4);
      local_1070 = auVar67._0_4_;
      *(undefined4 *)(in_RDI + (local_dccc + 2) * in_ESI) = local_1070;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uStack_1d18;
      auVar67 = vpunpcklqdq_avx(auVar4,auVar63 << 0x40);
      local_1010 = auVar67._0_4_;
      *(undefined4 *)(in_RDI + (local_dccc + 3) * in_ESI) = local_1010;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_1)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}